

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonAppendControlChar(JsonString *p,u8 c)

{
  u8 c_local;
  JsonString *p_local;
  
  if (""[c] == '\0') {
    p->zBuf[p->nUsed] = '\\';
    p->zBuf[p->nUsed + 1] = 'u';
    p->zBuf[p->nUsed + 2] = '0';
    p->zBuf[p->nUsed + 3] = '0';
    p->zBuf[p->nUsed + 4] = "0123456789abcdef"[(int)(uint)c >> 4];
    p->zBuf[p->nUsed + 5] = "0123456789abcdef"[(int)(c & 0xf)];
    p->nUsed = p->nUsed + 6;
  }
  else {
    p->zBuf[p->nUsed] = '\\';
    p->zBuf[p->nUsed + 1] = ""[c];
    p->nUsed = p->nUsed + 2;
  }
  return;
}

Assistant:

static void jsonAppendControlChar(JsonString *p, u8 c){
  static const char aSpecial[] = {
     0, 0, 0, 0, 0, 0, 0, 0, 'b', 't', 'n', 0, 'f', 'r', 0, 0,
     0, 0, 0, 0, 0, 0, 0, 0,   0,   0,   0, 0,   0,   0, 0, 0
  };
  assert( sizeof(aSpecial)==32 );
  assert( aSpecial['\b']=='b' );
  assert( aSpecial['\f']=='f' );
  assert( aSpecial['\n']=='n' );
  assert( aSpecial['\r']=='r' );
  assert( aSpecial['\t']=='t' );
  assert( c>=0 && c<sizeof(aSpecial) );
  assert( p->nUsed+7 <= p->nAlloc );
  if( aSpecial[c] ){
    p->zBuf[p->nUsed] = '\\';
    p->zBuf[p->nUsed+1] = aSpecial[c];
    p->nUsed += 2;
  }else{
    p->zBuf[p->nUsed] = '\\';
    p->zBuf[p->nUsed+1] = 'u';
    p->zBuf[p->nUsed+2] = '0';
    p->zBuf[p->nUsed+3] = '0';
    p->zBuf[p->nUsed+4] = "0123456789abcdef"[c>>4];
    p->zBuf[p->nUsed+5] = "0123456789abcdef"[c&0xf];
    p->nUsed += 6;
  }
}